

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

HashWriter * __thiscall
HashWriter::operator<<(HashWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *obj)

{
  HashWriter *in_RDI;
  long in_FS_OFFSET;
  HashWriter *os;
  
  os = *(HashWriter **)(in_FS_OFFSET + 0x28);
  Serialize<HashWriter,unsigned_char,std::allocator<unsigned_char>>
            (os,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  if (*(HashWriter **)(in_FS_OFFSET + 0x28) == os) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

HashWriter& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return *this;
    }